

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

Bool AfterSpaceImp(Lexer *lexer,Node *node,Bool isEmpty)

{
  Node *node_00;
  Bool BVar1;
  Node *prev;
  Bool isEmpty_local;
  Node *node_local;
  Lexer *lexer_local;
  
  BVar1 = prvTidynodeCMIsInline(node);
  if (BVar1 == no) {
    lexer_local._4_4_ = yes;
  }
  else {
    node_00 = node->prev;
    if (node_00 == (Node *)0x0) {
      if ((isEmpty != no) && (BVar1 = prvTidynodeCMIsInline(node->parent), BVar1 == no)) {
        return no;
      }
      lexer_local._4_4_ = AfterSpaceImp(lexer,node->parent,isEmpty);
    }
    else {
      BVar1 = prvTidynodeIsText(node_00);
      if (BVar1 == no) {
        if (((node_00 == (Node *)0x0) || (node_00->tag == (Dict *)0x0)) ||
           (node_00->tag->id != TidyTag_BR)) {
          lexer_local._4_4_ = no;
        }
        else {
          lexer_local._4_4_ = yes;
        }
      }
      else {
        lexer_local._4_4_ = prvTidyTextNodeEndWithSpace(lexer,node_00);
      }
    }
  }
  return lexer_local._4_4_;
}

Assistant:

static Bool AfterSpaceImp(Lexer *lexer, Node *node, Bool isEmpty)
{
    Node *prev;

    if ( !TY_(nodeCMIsInline)(node) )
        return yes;

    prev = node->prev;
    if (prev)
    {
        if (TY_(nodeIsText)(prev))
            return TY_(TextNodeEndWithSpace)( lexer, prev );
        else if (nodeIsBR(prev))
            return yes;

        return no;
    }

    if ( isEmpty && !TY_(nodeCMIsInline)(node->parent) )
        return no;

    return AfterSpaceImp(lexer, node->parent, isEmpty);
}